

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O0

void nosimd::arithmetic::abs<long>(long *pSrc,long *pDst,int len)

{
  int local_24;
  int local_20;
  int i_1;
  int i;
  int len_local;
  long *pDst_local;
  long *pSrc_local;
  
  if (pSrc == pDst) {
    for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
      if (pDst[local_20] < 0) {
        pDst[local_20] = -pDst[local_20];
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
      if (pSrc[local_24] < 0) {
        pDst[local_24] = -pSrc[local_24];
      }
      else {
        pDst[local_24] = pSrc[local_24];
      }
    }
  }
  return;
}

Assistant:

inline void abs(const _T * pSrc, _T * pDst, int len)
        {
            if (pSrc == pDst)
            {
                for (int i = 0; i < len; ++i)
                    if (pDst[i] < 0)
                        pDst[i] = -pDst[i];
            }
            else
            {
                for (int i = 0; i < len; ++i)
                {
                    if (pSrc[i] >= 0)
                        pDst[i] = pSrc[i];
                    else
                        pDst[i] = -pSrc[i];
                }
            }
        }